

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O3

void Hop_ObjPrintVerilog(FILE *pFile,Hop_Obj_t *pObj,Vec_Vec_t *vLevels,int Level,int fOnlyAnds)

{
  Vec_Ptr_t *pVVar1;
  uint uVar2;
  void **ppvVar3;
  void *pvVar4;
  long lVar5;
  int iVar6;
  Hop_Obj_t *pHVar7;
  char *pcVar8;
  char *__s;
  uint uVar9;
  int iVar10;
  uint uVar11;
  Hop_Obj_t *pFanin1;
  Hop_Obj_t *pFanin0;
  Hop_Obj_t *local_48;
  Hop_Obj_t *local_40;
  int local_38;
  uint local_34;
  
  uVar9 = (uint)pObj;
  uVar11 = uVar9 & 1;
  pHVar7 = (Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  uVar2 = *(uint *)&pHVar7->field_0x20 & 7;
  if (uVar2 == 2) {
    pcVar8 = "~";
    if (((ulong)pObj & 1) == 0) {
      pcVar8 = "";
    }
    fprintf((FILE *)pFile,"%s%s",pcVar8,(pHVar7->field_0).pData);
    return;
  }
  if (uVar2 == 1) {
    fprintf((FILE *)pFile,"1\'b%d",(ulong)(uVar11 ^ 1));
    return;
  }
  if (fOnlyAnds == 0) {
    if (uVar2 != 5) {
      iVar10 = Hop_ObjIsMuxType(pHVar7);
      if (iVar10 != 0) {
        iVar10 = Hop_ObjRecognizeExor(pHVar7,&local_40,&local_48);
        if (iVar10 == 0) {
          pHVar7 = Hop_ObjRecognizeMux(pHVar7,&local_48,&local_40);
          pcVar8 = "(";
          if (Level == 0) {
            pcVar8 = "";
          }
          __s = ")";
          if (Level == 0) {
            __s = "";
          }
          fputs(pcVar8,(FILE *)pFile);
          iVar10 = Level + 1;
          Hop_ObjPrintVerilog(pFile,pHVar7,vLevels,iVar10,0);
          fwrite(" ? ",3,1,(FILE *)pFile);
          Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)local_48 ^ (ulong)(uVar9 & 1)),vLevels,
                              iVar10,0);
          fwrite(" : ",3,1,(FILE *)pFile);
          Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)(uVar9 & 1) ^ (ulong)local_40),vLevels,
                              iVar10,0);
        }
        else {
          pcVar8 = "(";
          if (Level == 0) {
            pcVar8 = "";
          }
          __s = ")";
          if (Level == 0) {
            __s = "";
          }
          fputs(pcVar8,(FILE *)pFile);
          Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)(uVar9 & 1) ^ (ulong)local_40),vLevels,
                              Level + 1,0);
          fwrite(" ^ ",3,1,(FILE *)pFile);
          Hop_ObjPrintVerilog(pFile,local_48,vLevels,Level + 1,0);
        }
        goto LAB_00801bd3;
      }
      goto LAB_00801764;
    }
    iVar10 = vLevels->nSize;
    iVar6 = Level + 1;
    if (iVar10 <= Level) {
      if (vLevels->nCap <= Level) {
        if (vLevels->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((long)iVar6 << 3);
        }
        else {
          ppvVar3 = (void **)realloc(vLevels->pArray,(long)iVar6 << 3);
          iVar10 = vLevels->nSize;
        }
        vLevels->pArray = ppvVar3;
        vLevels->nCap = iVar6;
      }
      if (iVar10 <= Level) {
        lVar5 = (long)iVar10;
        iVar10 = (Level - iVar10) + 1;
        do {
          pvVar4 = calloc(1,0x10);
          vLevels->pArray[lVar5] = pvVar4;
          lVar5 = lVar5 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      vLevels->nSize = iVar6;
      iVar10 = iVar6;
    }
    if ((Level < 0) || (iVar10 <= Level)) goto LAB_00801be6;
    pVVar1 = (Vec_Ptr_t *)vLevels->pArray[(uint)Level];
    Hop_ObjCollectMulti(pHVar7,pVVar1);
    pcVar8 = "(";
    if (Level == 0) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    if (0 < pVVar1->nSize) {
      lVar5 = 0;
      do {
        Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)
                                  ((ulong)(lVar5 == 0 & (byte)uVar11) ^ (ulong)pVVar1->pArray[lVar5]
                                  ),vLevels,iVar6,0);
        iVar10 = pVVar1->nSize;
        if (lVar5 < (long)iVar10 + -1) {
          fwrite(" ^ ",3,1,(FILE *)pFile);
          iVar10 = pVVar1->nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar10);
    }
  }
  else {
LAB_00801764:
    iVar10 = vLevels->nSize;
    iVar6 = Level + 1;
    if (iVar10 <= Level) {
      local_34 = uVar11;
      if (vLevels->nCap <= Level) {
        if (vLevels->pArray == (void **)0x0) {
          local_38 = iVar10;
          ppvVar3 = (void **)malloc((long)iVar6 << 3);
          iVar10 = local_38;
        }
        else {
          ppvVar3 = (void **)realloc(vLevels->pArray,(long)iVar6 << 3);
          iVar10 = vLevels->nSize;
        }
        vLevels->pArray = ppvVar3;
        vLevels->nCap = iVar6;
      }
      if (iVar10 <= Level) {
        lVar5 = (long)iVar10;
        iVar10 = (Level - iVar10) + 1;
        do {
          pvVar4 = calloc(1,0x10);
          vLevels->pArray[lVar5] = pvVar4;
          lVar5 = lVar5 + 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      vLevels->nSize = iVar6;
      uVar11 = local_34;
      iVar10 = iVar6;
    }
    if ((Level < 0) || (iVar10 <= Level)) {
LAB_00801be6:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecVec.h"
                    ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
    }
    pVVar1 = (Vec_Ptr_t *)vLevels->pArray[(uint)Level];
    Hop_ObjCollectMulti(pHVar7,pVVar1);
    pcVar8 = "(";
    if (Level == 0) {
      pcVar8 = "";
    }
    fputs(pcVar8,(FILE *)pFile);
    if (0 < pVVar1->nSize) {
      pcVar8 = "|";
      if (uVar11 == 0) {
        pcVar8 = "&";
      }
      lVar5 = 0;
      do {
        Hop_ObjPrintVerilog(pFile,(Hop_Obj_t *)((ulong)pVVar1->pArray[lVar5] ^ (ulong)(uVar9 & 1)),
                            vLevels,iVar6,fOnlyAnds);
        iVar10 = pVVar1->nSize;
        if (lVar5 < (long)iVar10 + -1) {
          fprintf((FILE *)pFile," %s ",pcVar8);
          iVar10 = pVVar1->nSize;
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < iVar10);
    }
  }
  __s = ")";
  if (Level == 0) {
    __s = "";
  }
LAB_00801bd3:
  fputs(__s,(FILE *)pFile);
  return;
}

Assistant:

void Hop_ObjPrintVerilog( FILE * pFile, Hop_Obj_t * pObj, Vec_Vec_t * vLevels, int Level, int fOnlyAnds )
{
    Vec_Ptr_t * vSuper;
    Hop_Obj_t * pFanin, * pFanin0, * pFanin1, * pFaninC;
    int fCompl, i;
    // store the complemented attribute
    fCompl = Hop_IsComplement(pObj);
    pObj = Hop_Regular(pObj);
    // constant case
    if ( Hop_ObjIsConst1(pObj) )
    {
        fprintf( pFile, "1\'b%d", !fCompl );
        return;
    }
    // PI case
    if ( Hop_ObjIsPi(pObj) )
    {
        fprintf( pFile, "%s%s", fCompl? "~" : "", (char*)pObj->pData );
        return;
    }
    // EXOR case
    if ( !fOnlyAnds && Hop_ObjIsExor(pObj) )
    {
        Vec_VecExpand( vLevels, Level );
        vSuper = Vec_VecEntry( vLevels, Level );
        Hop_ObjCollectMulti( pObj, vSuper );
        fprintf( pFile, "%s", (Level==0? "" : "(") );
        Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
        {
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin, (fCompl && i==0)), vLevels, Level+1, fOnlyAnds );
            if ( i < Vec_PtrSize(vSuper) - 1 )
                fprintf( pFile, " ^ " );
        }
        fprintf( pFile, "%s", (Level==0? "" : ")") );
        return;
    }
    // MUX case
    if ( !fOnlyAnds && Hop_ObjIsMuxType(pObj) )
    {
        if ( Hop_ObjRecognizeExor( pObj, &pFanin0, &pFanin1 ) )
        {
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin0, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " ^ " );
            Hop_ObjPrintVerilog( pFile, pFanin1, vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        else 
        {
            pFaninC = Hop_ObjRecognizeMux( pObj, &pFanin1, &pFanin0 );
            fprintf( pFile, "%s", (Level==0? "" : "(") );
            Hop_ObjPrintVerilog( pFile, pFaninC, vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " ? " );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin1, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, " : " );
            Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin0, fCompl), vLevels, Level+1, fOnlyAnds );
            fprintf( pFile, "%s", (Level==0? "" : ")") );
        }
        return;
    }
    // AND case
    Vec_VecExpand( vLevels, Level );
    vSuper = Vec_VecEntry(vLevels, Level);
    Hop_ObjCollectMulti( pObj, vSuper );
    fprintf( pFile, "%s", (Level==0? "" : "(") );
    Vec_PtrForEachEntry( Hop_Obj_t *, vSuper, pFanin, i )
    {
        Hop_ObjPrintVerilog( pFile, Hop_NotCond(pFanin, fCompl), vLevels, Level+1, fOnlyAnds );
        if ( i < Vec_PtrSize(vSuper) - 1 )
            fprintf( pFile, " %s ", fCompl? "|" : "&" );
    }
    fprintf( pFile, "%s", (Level==0? "" : ")") );
    return;
}